

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void transproc(quadtype nextquad)

{
  char local_12 [8];
  char target [10];
  
  getlabel(nextquad.opcode,local_12);
  fprintf((FILE *)ofp,"; call ");
  fprintlexeme(ofp,nextquad.opcode);
  fprintf((FILE *)ofp,"\n");
  emitone(opccall,nextquad.opcode);
  fprintf((FILE *)ofp,"\n");
  return;
}

Assistant:

void    transproc(struct quadtype nextquad)
{
    char    target[LABELSIZE];
    
    getlabel(nextquad.op1.opnd, target);
    fprintf(ofp, "; call ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, "\n");
    emitone(opccall, nextquad.op1.opnd);
    fprintf(ofp, "\n");
}